

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h265e_api_v2.c
# Opt level: O0

MPP_RET hal_h265ev2_deinit(void *hal)

{
  long lVar1;
  void *ptr;
  MPP_RET ret;
  void *hw_ctx;
  MppEncHalApi *api;
  HalH265eV2Ctx *ctx;
  void *hal_local;
  
  lVar1 = *hal;
  ptr = *(void **)((long)hal + 8);
  if (((ptr == (void *)0x0) || (lVar1 == 0)) || (*(long *)(lVar1 + 0x20) == 0)) {
    hal_local._4_4_ = MPP_OK;
  }
  else {
    hal_local._4_4_ = (**(code **)(lVar1 + 0x20))(ptr);
    if (ptr != (void *)0x0) {
      mpp_osal_free("hal_h265ev2_deinit",ptr);
    }
  }
  return hal_local._4_4_;
}

Assistant:

static MPP_RET hal_h265ev2_deinit(void *hal)
{
    HalH265eV2Ctx *ctx = (HalH265eV2Ctx *)hal;
    const MppEncHalApi *api = ctx->api;
    void *hw_ctx = ctx->hw_ctx;
    MPP_RET ret = MPP_OK;

    if (!hw_ctx || !api || !api->deinit)
        return MPP_OK;

    ret = api->deinit(hw_ctx);
    MPP_FREE(hw_ctx);
    return ret;
}